

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testzlib.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  ssh_decompressor *psVar4;
  FILE *__stream;
  size_t sVar5;
  long lVar6;
  bool bVar7;
  char *__filename;
  char *pcVar8;
  int outlen;
  uchar *outbuf;
  uchar buf [16];
  int local_54;
  uchar *local_50;
  uchar local_48 [24];
  
  if (argc == 1) {
    psVar4 = zlib_decompress_init();
  }
  else {
    bVar7 = true;
    lVar6 = 1;
    bVar1 = false;
    pcVar8 = (char *)0x0;
    do {
      __filename = argv[lVar6];
      if (bVar7 && *__filename == '-') {
        pcVar2 = pcVar8;
        if ((__filename[1] == 'd') && (__filename[2] == '\0')) {
          bVar1 = true;
          bVar7 = true;
        }
        else if ((__filename[1] != '-') || (bVar7 = false, __filename[2] != '\0')) {
          iVar3 = strcmp(__filename,"--help");
          if (iVar3 == 0) {
            puts("usage: testzlib          decode zlib (RFC1950) data from standard input");
            puts("       testzlib -d       decode Deflate (RFC1951) data from standard input");
            puts("       testzlib --help   display this text");
            return 0;
          }
          pcVar8 = "unknown command line option \'%s\'\n";
          goto LAB_00101516;
        }
      }
      else {
        pcVar2 = __filename;
        if (pcVar8 != (char *)0x0) {
          main_cold_1();
          return 1;
        }
      }
      __filename = pcVar2;
      lVar6 = lVar6 + 1;
      pcVar8 = __filename;
    } while (argc != (int)lVar6);
    psVar4 = zlib_decompress_init();
    if ((bVar1) &&
       ((*psVar4->vt->decompress)(psVar4,main::ersatz_zlib_header,2,&local_50,&local_54),
       local_54 != 0)) {
      __assert_fail("outlen == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/test/testzlib.c"
                    ,0x4e,"int main(int, char **)");
    }
    if (__filename != (char *)0x0) {
      __stream = fopen(__filename,"rb");
      if (__stream == (FILE *)0x0) {
        pcVar8 = "unable to open \'%s\'\n";
LAB_00101516:
        fprintf(_stderr,pcVar8,__filename);
        return 1;
      }
      bVar1 = false;
      goto LAB_001013f6;
    }
  }
  bVar1 = true;
  __stream = _stdin;
  if (_stdin == (FILE *)0x0) {
    __assert_fail("filename",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/test/testzlib.c"
                  ,0x57,"int main(int, char **)");
  }
LAB_001013f6:
  sVar5 = fread(local_48,1,0x10,__stream);
  if (0 < (int)sVar5) {
    do {
      (*psVar4->vt->decompress)(psVar4,local_48,(int)sVar5,&local_50,&local_54);
      if (local_50 == (uchar *)0x0) {
        main_cold_2();
        return 1;
      }
      if ((long)local_54 != 0) {
        fwrite(local_50,1,(long)local_54,_stdout);
      }
      safefree(local_50);
      sVar5 = fread(local_48,1,0x10,__stream);
    } while (0 < (int)sVar5);
  }
  (*psVar4->vt->decompress_free)(psVar4);
  if (!bVar1) {
    fclose(__stream);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    unsigned char buf[16], *outbuf;
    int ret, outlen;
    ssh_decompressor *handle;
    int noheader = false, opts = true;
    char *filename = NULL;
    FILE *fp;

    while (--argc) {
        char *p = *++argv;

        if (p[0] == '-' && opts) {
            if (!strcmp(p, "-d")) {
                noheader = true;
            } else if (!strcmp(p, "--")) {
                opts = false;          /* next thing is filename */
            } else if (!strcmp(p, "--help")) {
                printf("usage: testzlib          decode zlib (RFC1950) data"
                       " from standard input\n");
                printf("       testzlib -d       decode Deflate (RFC1951) data"
                       " from standard input\n");
                printf("       testzlib --help   display this text\n");
                return 0;
            } else {
                fprintf(stderr, "unknown command line option '%s'\n", p);
                return 1;
            }
        } else if (!filename) {
            filename = p;
        } else {
            fprintf(stderr, "can only handle one filename\n");
            return 1;
        }
    }

    handle = ssh_decompressor_new(&ssh_zlib);

    if (noheader) {
        /*
         * Provide missing zlib header if -d was specified.
         */
        static const unsigned char ersatz_zlib_header[] = { 0x78, 0x9C };
        ssh_decompressor_decompress(
            handle, ersatz_zlib_header, sizeof(ersatz_zlib_header),
            &outbuf, &outlen);
        assert(outlen == 0);
    }

    if (filename)
        fp = fopen(filename, "rb");
    else
        fp = stdin;

    if (!fp) {
        assert(filename);
        fprintf(stderr, "unable to open '%s'\n", filename);
        return 1;
    }

    while (1) {
        ret = fread(buf, 1, sizeof(buf), fp);
        if (ret <= 0)
            break;
        ssh_decompressor_decompress(handle, buf, ret, &outbuf, &outlen);
        if (outbuf) {
            if (outlen)
                fwrite(outbuf, 1, outlen, stdout);
            sfree(outbuf);
        } else {
            fprintf(stderr, "decoding error\n");
            fclose(fp);
            return 1;
        }
    }

    ssh_decompressor_free(handle);

    if (filename)
        fclose(fp);

    return 0;
}